

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O2

void bench_field_is_square_var(void *arg,int iters)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  secp256k1_fe t;
  secp256k1_fe local_58;
  
  local_58.n[4] = *(uint64_t *)((long)arg + 0x60);
  local_58.n[0] = *(uint64_t *)((long)arg + 0x40);
  local_58.n[1] = *(uint64_t *)((long)arg + 0x48);
  local_58.n[2] = *(uint64_t *)((long)arg + 0x50);
  local_58.n[3] = *(uint64_t *)((long)arg + 0x58);
  iVar3 = 0;
  iVar2 = 0;
  if (0 < iters) {
    iVar3 = iters;
    iVar2 = 0;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    iVar1 = secp256k1_fe_impl_is_square_var(&local_58);
    iVar2 = iVar2 + iVar1;
    secp256k1_fe_impl_add(&local_58,(secp256k1_fe *)((long)arg + 0x68));
    secp256k1_fe_impl_normalize_var(&local_58);
  }
  if (iVar2 <= iters) {
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/bench_internal.c"
          ,0xf1,"test condition failed: j <= iters");
  abort();
}

Assistant:

static void bench_field_is_square_var(void* arg, int iters) {
    int i, j = 0;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_fe t = data->fe[0];

    for (i = 0; i < iters; i++) {
        j += secp256k1_fe_is_square_var(&t);
        secp256k1_fe_add(&t, &data->fe[1]);
        secp256k1_fe_normalize_var(&t);
    }
    CHECK(j <= iters);
}